

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

Vec_Str_t *
Bmc_CollapseOne_int(sat_solver *pSat,int nVars,int nCubeLim,int nBTLimit,int fCanon,int fReverse,
                   int fVerbose)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  void *pvVar8;
  undefined8 *puVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Vec_Int_t *p;
  Vec_Int_t *pVVar12;
  Vec_Int_t *vTemp;
  long lVar13;
  ulong uVar14;
  long lVar15;
  Vec_Str_t *vSop_00;
  uint uVar16;
  char *pcVar17;
  int i;
  int iVar18;
  uint uVar19;
  size_t sVar20;
  bool bVar21;
  int fComplete [2];
  int pLits [2];
  timespec ts;
  Vec_Str_t *vSop [2];
  abctime Time [2] [2];
  uint local_e4;
  long local_d8;
  long local_c0;
  int local_b0 [4];
  timespec local_a0;
  int local_90;
  int local_8c;
  uint *local_88 [2];
  Vec_Int_t *local_78;
  ABC_INT64_T local_70;
  int local_68;
  uint local_64;
  ulong local_60;
  long local_58 [5];
  
  uVar14 = (ulong)(uint)nVars;
  local_90 = nBTLimit;
  local_8c = fReverse;
  local_68 = fCanon;
  puVar7 = (uint *)malloc(0x10);
  puVar7[0] = 1000;
  puVar7[1] = 0;
  pvVar8 = malloc(1000);
  *(void **)(puVar7 + 2) = pvVar8;
  local_88[0] = puVar7;
  puVar9 = (undefined8 *)malloc(0x10);
  *puVar9 = 1000;
  pvVar8 = malloc(1000);
  puVar9[1] = pvVar8;
  iVar18 = nVars + 1;
  local_88[1] = (uint *)puVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < (uint)nVars) {
    iVar5 = iVar18;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar5;
  lVar15 = (long)iVar5;
  if (iVar5 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc(lVar15 * 4);
  }
  pVVar10->pArray = piVar11;
  p = (Vec_Int_t *)malloc(0x10);
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc(lVar15 * 4);
  }
  p->pArray = piVar11;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar5;
  if (iVar5 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc(lVar15 * 4);
  }
  pVVar12->pArray = piVar11;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nSize = 0;
  vTemp->nCap = iVar5;
  if (iVar5 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc(lVar15 << 2);
  }
  vTemp->pArray = piVar11;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_b0[0] = 0;
  local_b0[1] = 0;
  local_78 = pVVar12;
  if (local_8c == 0) {
    if (0 < nVars) {
      iVar5 = 3;
      do {
        Vec_IntPush(pVVar10,iVar5);
        iVar18 = iVar5 - nVars;
        iVar5 = iVar5 + 1;
      } while (iVar18 != 2);
    }
  }
  else if (0 < nVars) {
    do {
      Vec_IntPush(pVVar10,iVar18 + 1);
      iVar18 = iVar18 + -1;
    } while (1 < iVar18);
  }
  local_70 = (ABC_INT64_T)local_90;
  lVar15 = 0;
  do {
    local_b0[2] = (uint)lVar15 | 4;
    iVar5 = sat_solver_solve(pSat,local_b0 + 2,local_b0 + 3,local_70,0,0,0);
    if (iVar5 == 0) {
      local_e4 = 0;
      goto LAB_00588647;
    }
    if (iVar5 == -1) {
      puVar7[1] = 0;
      pcVar17 = " 1\n";
      if (lVar15 == 0) {
        pcVar17 = " 0\n";
      }
      lVar15 = 0;
      goto LAB_00588521;
    }
    puVar3 = local_88[lVar15];
    uVar19 = *puVar3;
    if (puVar3[1] == uVar19) {
      if ((int)uVar19 < 0x10) {
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar8 = malloc(0x10);
        }
        else {
          pvVar8 = realloc(*(void **)(puVar3 + 2),0x10);
        }
        *(void **)(puVar3 + 2) = pvVar8;
        sVar20 = 0x10;
      }
      else {
        sVar20 = (ulong)uVar19 * 2;
        if ((int)sVar20 <= (int)uVar19) goto LAB_00587f77;
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar8 = malloc(sVar20);
        }
        else {
          pvVar8 = realloc(*(void **)(puVar3 + 2),sVar20);
        }
        *(void **)(puVar3 + 2) = pvVar8;
      }
      *puVar3 = (uint)sVar20;
    }
LAB_00587f77:
    uVar19 = puVar3[1];
    puVar3[1] = uVar19 + 1;
    *(undefined1 *)(*(long *)(puVar3 + 2) + (long)(int)uVar19) = 0;
    lVar15 = lVar15 + 1;
  } while (lVar15 == 1);
  if (nCubeLim < 0) {
    local_e4 = 0;
  }
  else {
    local_c0 = 0;
    local_e4 = 0;
    local_60 = uVar14;
    do {
      local_d8 = 0;
      do {
        if (fVerbose != 0) {
          iVar5 = clock_gettime(3,&local_a0);
          if (iVar5 < 0) {
            local_c0 = -1;
          }
          else {
            local_c0 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
          }
        }
        piVar11 = pVVar10->pArray;
        iVar5 = pVVar10->nSize;
        lVar15 = (long)iVar5;
        if (0 < lVar15) {
          lVar13 = 0;
          do {
            pSat->polarity[piVar11[lVar13]] = '\0';
            lVar13 = lVar13 + 1;
          } while (lVar15 != lVar13);
        }
        local_b0[2] = (uint)local_d8 | 4;
        local_58[4] = (long)*(uint *)(&DAT_009e8970 + local_d8 * 4);
        local_b0[3] = *(uint *)(&DAT_009e8970 + local_d8 * 4) * 2 + 1;
        iVar18 = sat_solver_solve(pSat,local_b0 + 2,(lit *)&local_a0,0,0,0,0);
        if (fVerbose != 0) {
          iVar6 = clock_gettime(3,&local_a0);
          if (iVar6 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
          }
          local_58[local_d8 * 2] = local_58[local_d8 * 2] + (lVar13 - local_c0);
        }
        if (iVar18 == -1) {
LAB_005884c1:
          local_b0[local_d8] = 1;
          break;
        }
        if (iVar18 == 0) goto LAB_00588647;
        p->nSize = 0;
        if (0 < iVar5) {
          lVar13 = 0;
          do {
            iVar5 = piVar11[lVar13];
            if (((long)iVar5 < 0) || (pSat->size <= iVar5)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            Vec_IntPush(p,(uint)(pSat->model[iVar5] != 1) + iVar5 * 2);
            lVar13 = lVar13 + 1;
          } while (lVar15 != lVar13);
        }
        if (fVerbose != 0) {
          iVar5 = clock_gettime(3,&local_a0);
          if (iVar5 < 0) {
            local_c0 = -1;
          }
          else {
            local_c0 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
          }
        }
        iVar5 = Bmc_CollapseExpand(pSat,(sat_solver *)0x0,p,local_78,vTemp,local_90,local_68,
                                   5 - (uint)local_d8);
        if (fVerbose != 0) {
          iVar18 = clock_gettime(3,&local_a0);
          if (iVar18 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
          }
          local_58[local_d8 * 2 + 1] = local_58[local_d8 * 2 + 1] + (lVar15 - local_c0);
        }
        pVVar12 = local_78;
        if (iVar5 < 0) goto LAB_00588647;
        puVar7 = local_88[local_d8];
        uVar19 = puVar7[1];
        if ((int)uVar19 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x249,"char Vec_StrPop(Vec_Str_t *)");
        }
        pvVar8 = *(void **)(puVar7 + 2);
        local_64 = uVar19 - 1;
        puVar7[1] = local_64;
        iVar5 = (int)uVar14;
        uVar16 = iVar5 + uVar19 + 3;
        if ((int)uVar19 <= (int)uVar16) {
          uVar2 = *puVar7;
          sVar20 = (long)(int)uVar2 * 2;
          if ((int)sVar20 < (int)uVar16) {
            if ((int)uVar2 < (int)uVar16) {
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc((long)(int)uVar16);
              }
              else {
                pvVar8 = realloc(pvVar8,(long)(int)uVar16);
              }
              sVar20 = (size_t)uVar16;
LAB_005882e7:
              *(void **)(puVar7 + 2) = pvVar8;
              *puVar7 = (uint)sVar20;
            }
          }
          else if ((int)uVar2 < (int)sVar20 && (int)uVar2 < (int)uVar16) {
            if (pvVar8 == (void *)0x0) {
              pvVar8 = malloc(sVar20);
            }
            else {
              pvVar8 = realloc(pvVar8,sVar20);
            }
            goto LAB_005882e7;
          }
          lVar15 = (long)(int)puVar7[1];
          if ((int)puVar7[1] < (int)uVar16) {
            do {
              *(undefined1 *)(*(long *)(puVar7 + 2) + lVar15) = 0x2d;
              lVar15 = lVar15 + 1;
            } while ((int)uVar16 != lVar15);
          }
          puVar7[1] = uVar16;
        }
        uVar16 = (iVar5 + uVar19) - 1;
        if (((int)uVar16 < 0) || ((int)puVar7[1] <= (int)uVar16)) {
LAB_00588901:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        uVar14 = (ulong)uVar16;
        *(undefined1 *)(*(long *)(puVar7 + 2) + uVar14) = 0x20;
        uVar19 = uVar19 + iVar5;
        if (((int)uVar19 < 0) || ((int)puVar7[1] <= (int)uVar19)) goto LAB_00588901;
        *(byte *)(*(long *)(puVar7 + 2) + (ulong)uVar19) = local_d8 == 0 | 0x30;
        if ((int)puVar7[1] <= (int)(uVar14 + 2)) goto LAB_00588901;
        local_70 = CONCAT44(local_70._4_4_,uVar16);
        *(undefined1 *)(*(long *)(puVar7 + 2) + uVar14 + 2) = 10;
        if ((int)puVar7[1] <= (int)(uVar14 + 3)) goto LAB_00588901;
        *(undefined1 *)(*(long *)(puVar7 + 2) + uVar14 + 3) = 0;
        vTemp->nSize = 0;
        Vec_IntPush(vTemp,(int)local_58[4] * 2);
        iVar5 = pVVar12->nSize;
        if (0 < (long)iVar5) {
          piVar11 = local_78->pArray;
          lVar15 = 0;
          do {
            uVar19 = piVar11[lVar15];
            if (((long)(int)uVar19 < 0) || (p->nSize <= (int)uVar19)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar16 = p->pArray[(int)uVar19];
            if ((int)uVar16 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            Vec_IntPush(vTemp,uVar16 ^ 1);
            if (local_8c == 0) {
              uVar19 = uVar19 + local_64;
            }
            else {
              uVar19 = ~uVar19 + (int)local_70;
            }
            if (((int)uVar19 < 0) || ((int)puVar7[1] <= (int)uVar19)) goto LAB_00588901;
            *(byte *)(*(long *)(puVar7 + 2) + (ulong)uVar19) = (byte)uVar16 & 1 ^ 0x31;
            lVar15 = lVar15 + 1;
          } while (iVar5 != lVar15);
        }
        iVar5 = sat_solver_addclause(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize);
        uVar14 = local_60;
        if (iVar5 != 1) {
          if (iVar5 != 0) {
            __assert_fail("status == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                          ,0x5d2,
                          "Vec_Str_t *Bmc_CollapseOne_int(sat_solver *, int, int, int, int, int, int)"
                         );
          }
          goto LAB_005884c1;
        }
        bVar21 = local_d8 == 0;
        local_d8 = local_d8 + 1;
      } while (bVar21);
    } while ((local_b0[1] == 0 && local_b0[0] == 0) &&
            (local_e4 = local_e4 + 1, (int)local_e4 < nCubeLim || nCubeLim == 0));
  }
  goto LAB_00588647;
LAB_00588521:
  do {
    cVar1 = pcVar17[lVar15];
    uVar19 = *puVar7;
    if (puVar7[1] == uVar19) {
      if ((int)uVar19 < 0x10) {
        if (*(void **)(puVar7 + 2) == (void *)0x0) {
          pvVar8 = malloc(0x10);
        }
        else {
          pvVar8 = realloc(*(void **)(puVar7 + 2),0x10);
        }
        sVar20 = 0x10;
      }
      else {
        sVar20 = (ulong)uVar19 * 2;
        if ((int)sVar20 <= (int)uVar19) goto LAB_0058857a;
        if (*(void **)(puVar7 + 2) == (void *)0x0) {
          pvVar8 = malloc(sVar20);
        }
        else {
          pvVar8 = realloc(*(void **)(puVar7 + 2),sVar20);
        }
      }
      *(void **)(puVar7 + 2) = pvVar8;
      *puVar7 = (uint)sVar20;
    }
LAB_0058857a:
    uVar19 = puVar7[1];
    puVar7[1] = uVar19 + 1;
    *(char *)(*(long *)(puVar7 + 2) + (long)(int)uVar19) = cVar1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  uVar19 = *puVar7;
  if (puVar7[1] == uVar19) {
    if ((int)uVar19 < 0x10) {
      if (*(void **)(puVar7 + 2) == (void *)0x0) {
        pvVar8 = malloc(0x10);
      }
      else {
        pvVar8 = realloc(*(void **)(puVar7 + 2),0x10);
      }
      sVar20 = 0x10;
    }
    else {
      sVar20 = (ulong)uVar19 * 2;
      if ((int)sVar20 <= (int)uVar19) goto LAB_00588624;
      if (*(void **)(puVar7 + 2) == (void *)0x0) {
        pvVar8 = malloc(sVar20);
      }
      else {
        pvVar8 = realloc(*(void **)(puVar7 + 2),sVar20);
      }
    }
    *(void **)(puVar7 + 2) = pvVar8;
    *puVar7 = (uint)sVar20;
  }
LAB_00588624:
  uVar19 = puVar7[1];
  puVar7[1] = uVar19 + 1;
  *(undefined1 *)(*(long *)(puVar7 + 2) + (long)(int)uVar19) = 0;
  local_b0[0] = 1;
  local_e4 = 0;
LAB_00588647:
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  pVVar10 = local_78;
  if (local_78->pArray != (int *)0x0) {
    free(local_78->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (int *)0x0;
  }
  free(vTemp);
  if (local_b0[1] == 0 || local_b0[0] == 0) {
    iVar5 = (int)uVar14;
    if (local_b0[0] == 0 && local_b0[1] == 0) {
      vSop_00 = (Vec_Str_t *)0x0;
    }
    else {
      vSop_00 = (Vec_Str_t *)local_88[local_b0[1]];
      local_88[local_b0[1]] = (uint *)0x0;
      if (1 < local_e4) {
        Bmc_CollapseIrredundantFull(vSop_00,vSop_00->nSize / (iVar5 + 3),iVar5);
      }
    }
    if (fVerbose != 0) {
      printf("Processed output with %d supp vars. ",uVar14 & 0xffffffff);
      if (vSop_00 == (Vec_Str_t *)0x0) {
        pcVar17 = "The resulting SOP exceeded %d cubes.\n";
        uVar14 = (ulong)(uint)nCubeLim;
      }
      else {
        pcVar17 = "The best cover contains %d cubes.\n";
        uVar14 = (long)vSop_00->nSize / (long)(iVar5 + 3) & 0xffffffff;
      }
      printf(pcVar17,uVar14);
      dVar4 = (double)local_58[0];
      iVar5 = (int)pcVar17;
      Abc_Print(iVar5,"%s =","Onset  minterm");
      Abc_Print(iVar5,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
      dVar4 = (double)local_58[1];
      Abc_Print(iVar5,"%s =","Onset  expand ");
      Abc_Print(iVar5,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
      dVar4 = (double)local_58[2];
      Abc_Print(iVar5,"%s =","Offset minterm");
      Abc_Print(iVar5,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
      dVar4 = (double)local_58[3];
      Abc_Print(iVar5,"%s =","Offset expand ");
      Abc_Print(iVar5,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
    }
    puVar7 = local_88[0];
    if (local_88[0] != (uint *)0x0) {
      if (*(void **)(local_88[0] + 2) != (void *)0x0) {
        free(*(void **)(local_88[0] + 2));
        puVar7[2] = 0;
        puVar7[3] = 0;
      }
      free(puVar7);
      local_88[0] = (uint *)0x0;
    }
    puVar7 = local_88[1];
    if (local_88[1] != (uint *)0x0) {
      if (*(void **)((long)local_88[1] + 8) != (void *)0x0) {
        free(*(void **)((long)local_88[1] + 8));
        *(undefined8 *)((long)puVar7 + 8) = 0;
      }
      free(puVar7);
    }
    return vSop_00;
  }
  __assert_fail("!fComplete[0] || !fComplete[1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                ,0x5dc,"Vec_Str_t *Bmc_CollapseOne_int(sat_solver *, int, int, int, int, int, int)")
  ;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne_int( sat_solver * pSat, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    Vec_Str_t * vSop[2]   = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vVars = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars+1 );
    int n, v, iVar, pLits[2], iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};
    // variables
    int iOutVar    = 2;
    int iOOVars[2] = {0, 1};
//    int iOutVar    = 1;
//    int iOOVars[2] = {sat_solver_nvars(pSat) - 5, sat_solver_nvars(pSat) - 5 + 1};

    // collect CI variables (0 = onset enable, 1 = offset enable, 2 = output)
    int iCiVarBeg = 3;
//    int iCiVarBeg = sat_solver_nvars(pSat) - 5 - nVars;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        pLits[0] = Abc_Var2Lit( iOutVar, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat, pLits, pLits + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            sat_solver_clean_polarity( pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );
            pLits[0] = Abc_Var2Lit( iOutVar, n );    // set output
            pLits[1] = Abc_Var2Lit( iOOVars[n], 1 ); // enable clauses
            status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntForEachEntry( vVars, iVar, v )
                Vec_IntPush( vLits, Abc_Var2Lit(iVar, !sat_solver_var_value(pSat, iVar)) );
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
            status = Bmc_CollapseExpand( pSat, NULL, vLits, vNums, vCube, nBTLimit, fCanon, Abc_Var2Lit(iOutVar, !n) );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntPush( vCube, Abc_Var2Lit( iOOVars[n], 0 ) );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                int iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
            status = sat_solver_addclause( pSat, Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}